

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crunch.cpp
# Opt level: O2

bool __thiscall crunch::convert(crunch *this)

{
  command_line_params *this_00;
  double dVar1;
  bool bVar2;
  int iVar3;
  _Rb_tree_node_base *p_Var4;
  file_desc *pfVar5;
  uint32 i;
  int iVar6;
  ulong uVar7;
  char *pcVar8;
  long lVar9;
  file_desc_vec files;
  param_map_const_iterator end;
  timer tm;
  
  files.m_p = (file_desc *)0x0;
  files.m_size = 0;
  files.m_capacity = 0;
  this_00 = &this->m_params;
  iVar3 = 0;
  iVar6 = 0;
  while( true ) {
    pcVar8 = "";
    if (iVar3 == 2) break;
    tm.m_start_time = 0;
    end._M_node = (_Base_ptr)0x0;
    if (iVar3 == 0) {
      pcVar8 = "file";
    }
    crnlib::command_line_params::find(this_00,pcVar8,(param_map_const_iterator *)&tm,&end);
    for (p_Var4 = (_Rb_tree_node_base *)tm.m_start_time; p_Var4 != end._M_node;
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      iVar6 = iVar6 + 1;
      lVar9 = 0;
      for (uVar7 = 0; uVar7 < *(uint *)&p_Var4[1]._M_right; uVar7 = uVar7 + 1) {
        bVar2 = process_input_spec(this,&files,
                                   (dynamic_string *)((long)&(p_Var4[1]._M_left)->_M_color + lVar9))
        ;
        if (!bVar2) {
          bVar2 = crnlib::command_line_params::get_value_as_bool(this_00,"ignoreerrors",0,false);
          if (!bVar2) goto LAB_0010a0bd;
        }
        lVar9 = lVar9 + 0x10;
      }
    }
    iVar3 = iVar3 + 1;
  }
  if (iVar6 == 0) {
    pcVar8 = "No input files specified!";
  }
  else {
    if ((files._8_8_ & 0xffffffff) != 0) {
      std::__sort<crnlib::find_files::file_desc*,__gnu_cxx::__ops::_Iter_less_iter>
                (files.m_p,files.m_p + (files._8_8_ & 0xffffffff));
      pfVar5 = std::__unique<crnlib::find_files::file_desc*,__gnu_cxx::__ops::_Iter_equal_to_iter>
                         (files.m_p,files.m_p + (files._8_8_ & 0xffffffff));
      crnlib::vector<crnlib::find_files::file_desc>::resize
                (&files,(uint)(((long)pfVar5 - (long)files.m_p) / 0x48),false);
      crnlib::timer::timer(&tm);
      crnlib::timer::start(&tm);
      bVar2 = process_files(this,&files);
      if (!bVar2) {
        bVar2 = crnlib::command_line_params::get_value_as_bool(this_00,"ignoreerrors",0,false);
        if (!bVar2) {
LAB_0010a0bd:
          bVar2 = false;
          goto LAB_0010a0bf;
        }
      }
      dVar1 = crnlib::timer::get_elapsed_secs(&tm);
      bVar2 = true;
      crnlib::console::printf("Total time: %3.3fs",SUB84(dVar1,0));
      crnlib::console::printf
                ((char *)(ulong)((uint)(this->m_num_failed != 0 || this->m_num_skipped != 0) * 3 + 2
                                ),
                 "%u total file(s) successfully processed, %u file(s) skipped, %u file(s) failed.",
                 (ulong)this->m_num_succeeded);
      goto LAB_0010a0bf;
    }
    pcVar8 = "No files found to process!";
  }
  bVar2 = false;
  crnlib::console::error(pcVar8);
LAB_0010a0bf:
  crnlib::vector<crnlib::find_files::file_desc>::~vector(&files);
  return bVar2;
}

Assistant:

bool convert() {
    find_files::file_desc_vec files;

    uint32 total_input_specs = 0;

    for (uint32 phase = 0; phase < 2; phase++) {
      command_line_params::param_map_const_iterator begin, end;
      m_params.find(phase ? "" : "file", begin, end);
      for (command_line_params::param_map_const_iterator it = begin; it != end; ++it) {
        total_input_specs++;

        const dynamic_string_array& strings = it->second.m_values;
        for (uint32 i = 0; i < strings.size(); i++) {
          if (!process_input_spec(files, strings[i])) {
            if (!m_params.get_value_as_bool("ignoreerrors"))
              return false;
          }
        }
      }
    }

    if (!total_input_specs) {
      console::error("No input files specified!");
      return false;
    }

    if (files.empty()) {
      console::error("No files found to process!");
      return false;
    }

    std::sort(files.begin(), files.end());
    files.resize((uint32)(std::unique(files.begin(), files.end()) - files.begin()));

    timer tm;
    tm.start();

    if (!process_files(files)) {
      if (!m_params.get_value_as_bool("ignoreerrors"))
        return false;
    }

    double total_time = tm.get_elapsed_secs();

    console::printf("Total time: %3.3fs", total_time);

    console::printf(
        ((m_num_skipped) || (m_num_failed)) ? cWarningConsoleMessage : cInfoConsoleMessage,
        "%u total file(s) successfully processed, %u file(s) skipped, %u file(s) failed.", m_num_succeeded, m_num_skipped, m_num_failed);

    return true;
  }